

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

void __thiscall VGMPlayer::~VGMPlayer(VGMPlayer *this)

{
  long *plVar1;
  void *pvVar2;
  pointer pDVar3;
  pointer pCVar4;
  long *plVar5;
  pointer pXVar6;
  pointer pXVar7;
  pointer puVar8;
  long lVar9;
  
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__VGMPlayer_00194098;
  (this->super_PlayerBase)._eventCbFunc = (PLAYER_EVENT_CB)0x0;
  if ((this->_playState & 1) != 0) {
    Stop(this);
  }
  (*(this->super_PlayerBase)._vptr_PlayerBase[6])(this);
  if (this->_cpcUTF16 != (CPCONV *)0x0) {
    CPConv_Deinit(this->_cpcUTF16);
  }
  lVar9 = 27000;
  do {
    pvVar2 = *(void **)((long)this + lVar9 + -0x10);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar9) -
                             (long)pvVar2);
    }
    pvVar2 = *(void **)((long)this + lVar9 + -0x28);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)this + lVar9 + -0x18) - (long)pvVar2);
    }
    pvVar2 = *(void **)((long)this + lVar9 + -0x40);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)this + lVar9 + -0x30) - (long)pvVar2);
    }
    lVar9 = lVar9 + -0x48;
  } while (lVar9 != 0x5778);
  pDVar3 = (this->_dacStreams).
           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pDVar3 != (pointer)0x0) {
    operator_delete(pDVar3,(long)(this->_dacStreams).
                                 super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_devNames);
  pCVar4 = (this->_devices).
           super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar4 != (pointer)0x0) {
    operator_delete(pCVar4,(long)(this->_devices).
                                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar4);
  }
  std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::~vector
            (&this->_devCfgs);
  lVar9 = 0x448;
  do {
    plVar1 = (long *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar9);
    plVar5 = *(long **)((long)this + lVar9 + -0x10);
    if (plVar1 != plVar5) {
      operator_delete(plVar5,*plVar1 + 1);
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != 0x2e8);
  pXVar6 = (this->_xHdrChipVol).
           super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pXVar6 != (pointer)0x0) {
    operator_delete(pXVar6,(long)(this->_xHdrChipVol).
                                 super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pXVar6);
  }
  pXVar7 = (this->_xHdrChipClk).
           super__Vector_base<VGMPlayer::XHDR_DATA32,_std::allocator<VGMPlayer::XHDR_DATA32>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pXVar7 != (pointer)0x0) {
    operator_delete(pXVar7,(long)(this->_xHdrChipClk).
                                 super__Vector_base<VGMPlayer::XHDR_DATA32,_std::allocator<VGMPlayer::XHDR_DATA32>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pXVar7);
  }
  puVar8 = (this->_yrwRom).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar8 != (pointer)0x0) {
    operator_delete(puVar8,(long)(this->_yrwRom).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar8);
  }
  PlayerBase::~PlayerBase(&this->super_PlayerBase);
  return;
}

Assistant:

VGMPlayer::~VGMPlayer()
{
	_eventCbFunc = NULL;	// prevent any callbacks during destruction
	
	if (_playState & PLAYSTATE_PLAY)
		Stop();
	UnloadFile();
	
	if (_cpcUTF16 != NULL)
		CPConv_Deinit(_cpcUTF16);
	
	return;
}